

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void spawn_helper(uv_pipe_t *channel,uv_process_t *process,char *helper)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined4 local_4c8 [2];
  uv_stdio_container_t stdio [3];
  undefined1 *puStack_488;
  int r;
  char *args [3];
  undefined1 local_468 [8];
  char exepath [1024];
  size_t exepath_size;
  uv_process_options_t options;
  char *helper_local;
  uv_process_t *process_local;
  uv_pipe_t *channel_local;
  
  options._56_8_ = helper;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,channel,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,299,"r == 0");
    abort();
  }
  if (channel->ipc == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,300,"channel->ipc");
    abort();
  }
  exepath[0x3f8] = '\0';
  exepath[0x3f9] = '\x04';
  exepath[0x3fa] = '\0';
  exepath[0x3fb] = '\0';
  exepath[0x3fc] = '\0';
  exepath[0x3fd] = '\0';
  exepath[0x3fe] = '\0';
  exepath[0x3ff] = '\0';
  iVar1 = uv_exepath(local_468,(size_t *)(exepath + 0x3f8));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x130,"r == 0");
    abort();
  }
  local_468[exepath._1016_8_] = 0;
  puStack_488 = local_468;
  args[0] = (char *)options._56_8_;
  args[1] = (char *)0x0;
  memset(&exepath_size,0,0x40);
  options.exit_cb = (uv_exit_cb)local_468;
  options.file = (char *)&stack0xfffffffffffffb78;
  exepath_size = (size_t)exit_cb;
  options._40_8_ = local_4c8;
  options.cwd._4_4_ = 3;
  local_4c8[0] = 0x31;
  stdio[0].data.fd = 2;
  stdio[1].flags = UV_CREATE_PIPE;
  stdio[1].data.fd = 2;
  stdio[2].flags = UV_INHERIT_FD;
  stdio[0]._0_8_ = channel;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,process,(uv_process_options_t *)&exepath_size);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x146,"r == 0");
    abort();
  }
  return;
}

Assistant:

void spawn_helper(uv_pipe_t* channel,
                  uv_process_t* process,
                  const char* helper) {
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[1024];
  char* args[3];
  int r;
  uv_stdio_container_t stdio[3];

  r = uv_pipe_init(uv_default_loop(), channel, 1);
  ASSERT(r == 0);
  ASSERT(channel->ipc);

  exepath_size = sizeof(exepath);
  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  exepath[exepath_size] = '\0';
  args[0] = exepath;
  args[1] = (char*)helper;
  args[2] = NULL;

  memset(&options, 0, sizeof(options));
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;
  options.stdio = stdio;
  options.stdio_count = ARRAY_SIZE(stdio);

  stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE | UV_WRITABLE_PIPE;
  stdio[0].data.stream = (uv_stream_t*) channel;
  stdio[1].flags = UV_INHERIT_FD;
  stdio[1].data.fd = 1;
  stdio[2].flags = UV_INHERIT_FD;
  stdio[2].data.fd = 2;

  r = uv_spawn(uv_default_loop(), process, &options);
  ASSERT(r == 0);
}